

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CartesianProductTest.cpp
# Opt level: O2

void __thiscall displayTest::test_method(displayTest *this)

{
  ostream *poVar1;
  string *psVar2;
  CartesianProduct S2;
  CartesianProduct S;
  RealSpace R2;
  CartesianProduct S3;
  S2 Sphere;
  RealSpace R5;
  SO3<mnf::ExpMapMatrix> RotSpace;
  
  mnf::RealSpace::RealSpace(&R5,5);
  mnf::Manifold::display();
  mnf::RealSpace::RealSpace(&R2,2);
  mnf::S2::S2(&Sphere);
  mnf::Manifold::display();
  mnf::SO3<mnf::ExpMapMatrix>::SO3(&RotSpace);
  _S2 = &R5;
  mnf::CartesianProduct::CartesianProduct(&S,&S2,6);
  mnf::CartesianProduct::CartesianProduct(&S2,(Manifold *)&S,(Manifold *)&R2);
  mnf::CartesianProduct::CartesianProduct(&S3,(Manifold *)&S,(Manifold *)&S2);
  poVar1 = std::operator<<((ostream *)&std::cout,"S.name() = \n");
  psVar2 = (string *)mnf::Manifold::name_abi_cxx11_();
  poVar1 = std::operator<<(poVar1,psVar2);
  std::endl<char,std::char_traits<char>>(poVar1);
  mnf::Manifold::display();
  poVar1 = std::operator<<((ostream *)&std::cout,"S2.name() = \n");
  psVar2 = (string *)mnf::Manifold::name_abi_cxx11_();
  poVar1 = std::operator<<(poVar1,psVar2);
  std::endl<char,std::char_traits<char>>(poVar1);
  mnf::Manifold::display();
  poVar1 = std::operator<<((ostream *)&std::cout,"S3.name() = \n");
  psVar2 = (string *)mnf::Manifold::name_abi_cxx11_();
  poVar1 = std::operator<<(poVar1,psVar2);
  std::endl<char,std::char_traits<char>>(poVar1);
  mnf::Manifold::display();
  mnf::CartesianProduct::~CartesianProduct(&S3);
  mnf::CartesianProduct::~CartesianProduct(&S2);
  mnf::CartesianProduct::~CartesianProduct(&S);
  mnf::SO3<mnf::ExpMapMatrix>::~SO3(&RotSpace);
  mnf::Manifold::~Manifold((Manifold *)&Sphere);
  mnf::RealSpace::~RealSpace(&R2);
  mnf::RealSpace::~RealSpace(&R5);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(displayTest)
{
  RealSpace R5(5);
  R5.display();
  RealSpace R2(2);
  S2 Sphere;
  Sphere.display();
  SO3<ExpMapMatrix> RotSpace;
  CartesianProduct S{&R5, &Sphere, &R2, &Sphere, &RotSpace, &R5};
  CartesianProduct S2(S, R2);
  CartesianProduct S3(S, S2);
  std::cout << "S.name() = \n" << S.name() << std::endl;
  S.display();
  std::cout << "S2.name() = \n" << S2.name() << std::endl;
  S2.display();
  std::cout << "S3.name() = \n" << S3.name() << std::endl;
  S3.display();
}